

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O0

char * format_mode(GLFWvidmode *mode)

{
  GLFWvidmode *mode_local;
  
  sprintf(format_mode::buffer,"%i x %i x %i (%i %i %i) %i Hz",(ulong)(uint)mode->width,
          (ulong)(uint)mode->height,(ulong)(uint)(mode->redBits + mode->greenBits + mode->blueBits),
          (ulong)(uint)mode->redBits,mode->greenBits,mode->blueBits,mode->refreshRate);
  format_mode::buffer[0x1ff] = '\0';
  return format_mode::buffer;
}

Assistant:

static const char* format_mode(const GLFWvidmode* mode)
{
    static char buffer[512];

    sprintf(buffer,
            "%i x %i x %i (%i %i %i) %i Hz",
            mode->width, mode->height,
            mode->redBits + mode->greenBits + mode->blueBits,
            mode->redBits, mode->greenBits, mode->blueBits,
            mode->refreshRate);

    buffer[sizeof(buffer) - 1] = '\0';
    return buffer;
}